

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_settings.cpp
# Opt level: O0

ON_ParseSettings * DoubleNumberSettingsHelper(void)

{
  ON__UINT16 OVar1;
  ON__UINT8 OVar2;
  ON__UINT8 OVar3;
  ON_ParseSettings *in_RDI;
  ON_ParseSettings *double_number_settings;
  
  *&in_RDI->m_true_default_bits = ON_ParseSettings::IntegerNumberSettings.m_true_default_bits;
  *&in_RDI->m_false_default_bits = ON_ParseSettings::IntegerNumberSettings.m_false_default_bits;
  OVar1 = ON_ParseSettings::IntegerNumberSettings.m_context_locale_id;
  OVar2 = ON_ParseSettings::IntegerNumberSettings.m_context_angle_unit_system;
  OVar3 = ON_ParseSettings::IntegerNumberSettings.m_context_length_unit_system;
  in_RDI->m_reserved_bits = ON_ParseSettings::IntegerNumberSettings.m_reserved_bits;
  in_RDI->m_context_locale_id = OVar1;
  in_RDI->m_context_angle_unit_system = OVar2;
  in_RDI->m_context_length_unit_system = OVar3;
  in_RDI->m_reserved = ON_ParseSettings::IntegerNumberSettings.m_reserved;
  ON_ParseSettings::SetParseSignificandDecimalPoint(in_RDI,true);
  ON_ParseSettings::SetParseSignificandFractionalPart(in_RDI,true);
  ON_ParseSettings::SetParseScientificENotation(in_RDI,true);
  return in_RDI;
}

Assistant:

static ON_ParseSettings DoubleNumberSettingsHelper()
{
  ON_ParseSettings double_number_settings(ON_ParseSettings::IntegerNumberSettings);
  // do not enable parsing of leading white space here
  double_number_settings.SetParseSignificandDecimalPoint(true);
  double_number_settings.SetParseSignificandFractionalPart(true);
  //double_number_settings.SetParseSignificandDigitSeparators(true);
  double_number_settings.SetParseScientificENotation(true);
  return double_number_settings;
}